

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replicode_common.h
# Opt level: O2

void __thiscall r_exec::CInput::CInput(CInput *this,CInput *param_2)

{
  _Object *p_Var1;
  uint64_t uVar2;
  undefined7 uVar3;
  
  p_Var1 = (param_2->bindings).object;
  (this->bindings).object = p_Var1;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  p_Var1 = (param_2->abstraction).object;
  (this->abstraction).object = p_Var1;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  p_Var1 = (param_2->input).object;
  (this->input).object = p_Var1;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  uVar3 = *(undefined7 *)&param_2->field_0x19;
  uVar2 = param_2->ijt;
  this->injected = param_2->injected;
  *(undefined7 *)&this->field_0x19 = uVar3;
  this->ijt = uVar2;
  return;
}

Assistant:

inline P(const P<C> &p) : object(p.object)
    {
        if (object) {
            object->incRef();
        }
    }